

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O2

void use_rtti(void)

{
  std::operator<<((ostream *)&std::cout,"rtti:\n");
}

Assistant:

void use_rtti() {
    std::cout << "rtti:\n";

    using namespace L15_5;
    using std::cout;
    using std::endl;
    using std::rand;

    Grand * pg;
    Superb * ps;
    for(int i = 0; i < 5; i++) {
        std::cout << i << ":\t\n";
        pg = get_one();
        //  pg certainly have 'speak'
        pg->speak();
        //  check if it is able to cast to derived class pointer
        if (ps = dynamic_cast<Superb *>(pg)) {
            ps->say();
            cout << "\n";
        } else {
            cout << "I am not able to say...\n\n";
        }

        //  since pg is address, *pg is the value behind the adress
//        Grand & rg = *pg;

        try {
            Superb & rs = dynamic_cast<Superb &>(*pg);
            cout << "Success cast to ref...\n";
        } catch (std::bad_cast & err) {
            cout << "Error: " << err.what();
        }
    }
}